

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O2

void * dsAlloc(uint64_t length)

{
  uint64_t length_00;
  uint64_t offset;
  dsSuperObject *pdVar1;
  long lVar2;
  int iVar3;
  dsCrate *crate;
  ulong *puVar4;
  uint64_t *puVar5;
  ulong length_01;
  ulong length_02;
  char *pcVar6;
  long lVar7;
  
  crate = getActiveCrate();
  if (crate == (dsCrate *)0x0) {
    pcVar6 = "%s(): Can\'t get active crate.\n";
    goto LAB_00102b1f;
  }
  debugDump(crate);
  length_00 = length + 0x18;
  iVar3 = getGroup(length_00);
  lVar2 = (long)iVar3;
  do {
    lVar7 = lVar2;
    if (7 < lVar7) goto LAB_00102b18;
    offset = crate->super->headGroupOffset[lVar7];
    lVar2 = lVar7 + 1;
  } while (offset == 0xffffffffffffffff);
  puVar4 = (ulong *)mapObject(crate,offset,0x10);
  if (puVar4 == (ulong *)0x0) {
    length_02 = 0x10;
LAB_00102a0d:
    dsRunLogCallback("%s(): Can\'t mapObject(,%lu,%lu)\n","allocateObject",offset,length_02);
  }
  else {
    if ((long)*puVar4 < 0) {
      length_02 = *puVar4 & 0x3fffffffffffffff;
      length_01 = length_02 - length_00;
      if (length_02 < length_00) {
        pcVar6 = "%s(): Object groups are corrupt!\n";
      }
      else if (crate->super->headGroupOffset[lVar7] == offset) {
        crate->super->headGroupOffset[lVar7] = puVar4[1];
        puVar4[1] = 0xffffffffffffffff;
        puVar5 = (uint64_t *)mapObject(crate,offset,length_02);
        if (puVar5 == (uint64_t *)0x0) goto LAB_00102a0d;
        if (length_02 < length + 0x31) {
LAB_00102b72:
          *puVar5 = length_02;
          puVar5[1] = 0xffffffffffffffff;
          *(uint64_t *)((long)puVar5 + (length_02 - 8)) = offset;
          debugDump(crate);
          return puVar5 + 2;
        }
        *(ulong *)(length_00 + (long)puVar5) = length_01 | 0x8000000000000000;
        *(undefined8 *)(length + 0x20 + (long)puVar5) = 0xffffffffffffffff;
        puVar4 = (ulong *)(length_00 + (long)puVar5);
        *(uint64_t *)(((length_01 & 0x3fffffffffffffff) - 8) + (long)puVar4) = offset + length_00;
        if ((*puVar5 & 0x4000000000000000) != 0) {
          *puVar4 = *puVar4 | 0x4000000000000000;
        }
        iVar3 = getGroup(length_01);
        if (iVar3 < 8) {
          pdVar1 = crate->super;
          puVar4[1] = pdVar1->headGroupOffset[iVar3];
          pdVar1->headGroupOffset[iVar3] = offset + length_00;
          length_02 = length_00;
          goto LAB_00102b72;
        }
        dsRunLogCallback("%s(): Group does not exist.\n","linkToGroup");
        pcVar6 = "%s(): Can\'t link free object.\n";
      }
      else {
        dsRunLogCallback("%s(): Free object isn\'t head of group.\n","unlinkFromGroup");
        pcVar6 = "%s(): Can\'t unlink free object.\n";
      }
    }
    else {
      pcVar6 = "%s(): Object should be free but isn\'t.\n";
    }
    dsRunLogCallback(pcVar6,"allocateObject");
  }
LAB_00102b18:
  pcVar6 = "%s(): Can\'t allocate object.\n";
LAB_00102b1f:
  dsRunLogCallback(pcVar6,"dsAlloc");
  return (void *)0x0;
}

Assistant:

void *
dsAlloc(uint64_t length)
{
	dsCrate *crate;
	void *memory;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return NULL;
	}

	if ((memory = allocateObject(crate, length)) == NULL) {
		dsLog("Can't allocate object.\n");
		return NULL;
	}

	memory += sizeof(dsObject);

	return memory;
}